

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrayref.h
# Opt level: O2

void __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::ReportSuffix<double>
          (BasicProblem<mp::BasicProblemParams<int>_> *this,SuffixDef<double> *sufdef,
          ArrayRef<double> *values)

{
  BasicMutSuffix<double> BVar1;
  long lVar2;
  bool bVar3;
  
  if (values->size_ != 0) {
    BVar1 = FindOrCreateSuffix<double>(this,sufdef);
    lVar2 = (long)*(int *)((long)BVar1.super_BasicSuffix<double>.super_SuffixBase.impl_ + 0x14);
    while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
      *(double *)
       (*(long *)((long)BVar1.super_BasicSuffix<double>.super_SuffixBase.impl_ + 0x18) + lVar2 * 8)
           = values->data_[lVar2];
    }
  }
  return;
}

Assistant:

bool empty() const { return 0 == size(); }